

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O1

MOJOSHADER_preshader * copypreshader(MOJOSHADER_preshader *src,MOJOSHADER_malloc m,void *d)

{
  MOJOSHADER_preshader *pMVar1;
  double *__dest;
  MOJOSHADER_symbol *__s;
  MOJOSHADER_preshaderInstruction *pMVar2;
  void *__dest_00;
  float *__dest_01;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long local_50;
  
  pMVar1 = (MOJOSHADER_preshader *)(*m)(0x58,d);
  *(undefined8 *)pMVar1 = 0;
  pMVar1->literals = (double *)0x0;
  pMVar1->temp_count = 0;
  pMVar1->symbol_count = 0;
  pMVar1->symbols = (MOJOSHADER_symbol *)0x0;
  *(undefined8 *)&pMVar1->instruction_count = 0;
  pMVar1->instructions = (MOJOSHADER_preshaderInstruction *)0x0;
  *(undefined8 *)&pMVar1->register_count = 0;
  pMVar1->registers = (float *)0x0;
  pMVar1->malloc = (MOJOSHADER_malloc)0x0;
  pMVar1->free = (MOJOSHADER_free)0x0;
  pMVar1->malloc_data = (void *)0x0;
  uVar3 = src->literal_count;
  pMVar1->literal_count = uVar3;
  uVar3 = uVar3 << 3;
  __dest = (double *)(*m)(uVar3,d);
  pMVar1->literals = __dest;
  memcpy(__dest,src->literals,(ulong)uVar3);
  pMVar1->temp_count = src->temp_count;
  uVar3 = src->symbol_count * 0x38;
  pMVar1->symbol_count = src->symbol_count;
  __s = (MOJOSHADER_symbol *)(*m)(uVar3,d);
  pMVar1->symbols = __s;
  memset(__s,0,(ulong)uVar3);
  if (pMVar1->symbol_count != 0) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      copysymbol((MOJOSHADER_symbol *)((long)&pMVar1->symbols->name + lVar4),
                 (MOJOSHADER_symbol *)((long)&src->symbols->name + lVar4),m,d);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x38;
    } while (uVar5 < pMVar1->symbol_count);
  }
  uVar3 = src->instruction_count * 0x70;
  pMVar1->instruction_count = src->instruction_count;
  pMVar2 = (MOJOSHADER_preshaderInstruction *)(*m)(uVar3,d);
  pMVar1->instructions = pMVar2;
  memcpy(pMVar2,src->instructions,(ulong)uVar3);
  if (pMVar1->instruction_count != 0) {
    local_50 = 0;
    uVar5 = 0;
    do {
      pMVar2 = pMVar1->instructions;
      if (pMVar2[uVar5].operand_count != 0) {
        uVar6 = 0;
        lVar4 = local_50;
        do {
          uVar3 = *(int *)((long)&pMVar2->operands[0].array_register_count + lVar4) << 2;
          __dest_00 = (*m)(uVar3,d);
          *(void **)((long)&pMVar1->instructions->operands[0].array_registers + lVar4) = __dest_00;
          memcpy(__dest_00,*(void **)((long)&src->instructions->operands[0].array_registers + lVar4)
                 ,(ulong)uVar3);
          uVar6 = uVar6 + 1;
          pMVar2 = pMVar1->instructions;
          lVar4 = lVar4 + 0x18;
        } while (uVar6 < pMVar2[uVar5].operand_count);
      }
      uVar5 = uVar5 + 1;
      local_50 = local_50 + 0x70;
    } while (uVar5 < pMVar1->instruction_count);
  }
  uVar3 = src->register_count;
  pMVar1->register_count = uVar3;
  uVar3 = uVar3 << 4;
  __dest_01 = (float *)(*m)(uVar3,d);
  pMVar1->registers = __dest_01;
  memcpy(__dest_01,src->registers,(ulong)uVar3);
  return pMVar1;
}

Assistant:

MOJOSHADER_preshader *copypreshader(const MOJOSHADER_preshader *src,
                                    MOJOSHADER_malloc m,
                                    void *d)
{
    int i, j;
    uint32 siz;
    MOJOSHADER_preshader *retval;

    retval = (MOJOSHADER_preshader *) m(sizeof (MOJOSHADER_preshader), d);
    // !!! FIXME: Out of memory check!
    memset(retval, '\0', sizeof (MOJOSHADER_preshader));

    siz = sizeof (double) * src->literal_count;
    retval->literal_count = src->literal_count;
    retval->literals = (double *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memcpy(retval->literals, src->literals, siz);

    retval->temp_count = src->temp_count;

    siz = sizeof (MOJOSHADER_symbol) * src->symbol_count;
    retval->symbol_count = src->symbol_count;
    retval->symbols = (MOJOSHADER_symbol *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memset(retval->symbols, '\0', siz);

    for (i = 0; i < retval->symbol_count; i++)
        copysymbol(&retval->symbols[i], &src->symbols[i], m, d);

    siz = sizeof (MOJOSHADER_preshaderInstruction) * src->instruction_count;
    retval->instruction_count = src->instruction_count;
    retval->instructions = (MOJOSHADER_preshaderInstruction *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memcpy(retval->instructions, src->instructions, siz);
    for (i = 0; i < retval->instruction_count; i++)
        for (j = 0; j < retval->instructions[i].operand_count; j++)
        {
            siz = sizeof (unsigned int) * retval->instructions[i].operands[j].array_register_count;
            retval->instructions[i].operands[j].array_registers = (unsigned int *) m(siz, d);
            // !!! FIXME: Out of memory check!
            memcpy(retval->instructions[i].operands[j].array_registers,
                   src->instructions[i].operands[j].array_registers,
                   siz);
        } // for

    siz = sizeof (float) * 4 * src->register_count;
    retval->register_count = src->register_count;
    retval->registers = (float *) m(siz, d);
    // !!! FIXME: Out of memory check!
    memcpy(retval->registers, src->registers, siz);

    return retval;
}